

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint10.c
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t big, expected;
    _PDCLIB_bigint10( &big, 0 );
    _PDCLIB_bigint32( &expected, 1 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 1 );
    _PDCLIB_bigint32( &expected, 10 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 9 );
    _PDCLIB_bigint32( &expected, UINT32_C( 1000000000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 17 );
    _PDCLIB_bigint64( &expected, UINT32_C( 0x01634578 ), UINT32_C( 0x5d8a0000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 18 );
    _PDCLIB_bigint64( &expected, UINT32_C( 0x0de0b6b3 ), UINT32_C( 0xa7640000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );
#endif
    return TEST_RESULTS;
}